

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall fmt::v6::internal::utf8_to_utf16::utf8_to_utf16(utf8_to_utf16 *this,string_view s)

{
  allocator<wchar_t> *__src;
  size_t sVar1;
  char *pcVar2;
  type __n;
  char buf [7];
  long num_chars_left;
  char *end;
  size_t block_size;
  char *p;
  anon_class_8_1_8991fb9c transcode;
  allocator<wchar_t> *in_stack_ffffffffffffff28;
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *in_stack_ffffffffffffff30;
  allocator<wchar_t> *in_stack_ffffffffffffff58;
  allocator<wchar_t> *in_stack_ffffffffffffff60;
  undefined1 local_60 [16];
  allocator<wchar_t> *local_50;
  undefined8 local_48;
  allocator<wchar_t> *local_40;
  allocator<wchar_t> local_19 [9];
  basic_string_view<char> local_10;
  
  std::allocator<wchar_t>::allocator();
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_>::basic_memory_buffer
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::allocator<wchar_t>::~allocator(local_19);
  local_40 = (allocator<wchar_t> *)basic_string_view<char>::data(&local_10);
  local_48 = 4;
  sVar1 = basic_string_view<char>::size(&local_10);
  if (3 < sVar1) {
    in_stack_ffffffffffffff60 = local_40;
    sVar1 = basic_string_view<char>::size(&local_10);
    local_50 = in_stack_ffffffffffffff60 + (sVar1 - 3);
    while (local_40 < local_50) {
      in_stack_ffffffffffffff58 =
           (allocator<wchar_t> *)
           utf8_to_utf16::anon_class_8_1_8991fb9c::operator()
                     ((anon_class_8_1_8991fb9c *)in_stack_ffffffffffffff60,
                      (char *)in_stack_ffffffffffffff58);
      local_40 = in_stack_ffffffffffffff58;
    }
  }
  pcVar2 = basic_string_view<char>::data(&local_10);
  sVar1 = basic_string_view<char>::size(&local_10);
  __src = local_40;
  local_60._8_8_ = pcVar2 + (sVar1 - (long)local_40);
  if ((char *)local_60._8_8_ != (char *)0x0) {
    local_60._4_3_ = 0;
    local_60._0_4_ = 0;
    in_stack_ffffffffffffff30 =
         (basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *)local_60;
    __n = to_unsigned<long>(local_60._8_8_);
    memcpy(in_stack_ffffffffffffff30,__src,__n);
    local_40 = (allocator<wchar_t> *)local_60;
    do {
      in_stack_ffffffffffffff28 =
           (allocator<wchar_t> *)
           utf8_to_utf16::anon_class_8_1_8991fb9c::operator()
                     ((anon_class_8_1_8991fb9c *)in_stack_ffffffffffffff60,
                      (char *)in_stack_ffffffffffffff58);
      local_40 = in_stack_ffffffffffffff28;
    } while ((long)in_stack_ffffffffffffff28 - (long)local_60 < (long)local_60._8_8_);
  }
  buffer<wchar_t>::push_back
            ((buffer<wchar_t> *)in_stack_ffffffffffffff30,(wchar_t *)in_stack_ffffffffffffff28);
  return;
}

Assistant:

FMT_FUNC internal::utf8_to_utf16::utf8_to_utf16(string_view s) {
  auto transcode = [this](const char* p) {
    auto cp = uint32_t();
    auto error = 0;
    p = utf8_decode(p, &cp, &error);
    if (error != 0) FMT_THROW(std::runtime_error("invalid utf8"));
    if (cp <= 0xFFFF) {
      buffer_.push_back(static_cast<wchar_t>(cp));
    } else {
      cp -= 0x10000;
      buffer_.push_back(static_cast<wchar_t>(0xD800 + (cp >> 10)));
      buffer_.push_back(static_cast<wchar_t>(0xDC00 + (cp & 0x3FF)));
    }
    return p;
  };
  auto p = s.data();
  const size_t block_size = 4;  // utf8_decode always reads blocks of 4 chars.
  if (s.size() >= block_size) {
    for (auto end = p + s.size() - block_size + 1; p < end;) p = transcode(p);
  }
  if (auto num_chars_left = s.data() + s.size() - p) {
    char buf[2 * block_size - 1] = {};
    memcpy(buf, p, to_unsigned(num_chars_left));
    p = buf;
    do {
      p = transcode(p);
    } while (p - buf < num_chars_left);
  }
  buffer_.push_back(0);
}